

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_loader.cpp
# Opt level: O3

Ref<embree::SceneGraph::Node> __thiscall
embree::XMLLoader::loadBGFNode(XMLLoader *this,Ref<embree::XML> *xml)

{
  undefined8 uVar1;
  int iVar2;
  GroupNode *this_00;
  mapped_type *pmVar3;
  mapped_type *pmVar4;
  runtime_error *this_01;
  long *plVar5;
  FILE *pFVar6;
  long *in_RDX;
  size_t id;
  Ref<embree::SceneGraph::MaterialNode> material;
  XML *local_88;
  undefined1 local_80 [40];
  _Alloc_hider local_58;
  size_type local_50;
  undefined1 auStack_48 [40];
  
  local_88 = xml[0xb].ptr;
  xml[0xb].ptr = (XML *)((long)&(local_88->super_RefCount)._vptr_RefCount + 1);
  iVar2 = std::__cxx11::string::compare((char *)(*in_RDX + 0x30));
  if (iVar2 == 0) {
    loadBGFMesh((XMLLoader *)local_80,xml);
    pmVar3 = std::
             map<unsigned_long,_embree::Ref<embree::SceneGraph::Node>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_embree::Ref<embree::SceneGraph::Node>_>_>_>
             ::operator[]((map<unsigned_long,_embree::Ref<embree::SceneGraph::Node>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                           *)(xml + 0xc),(key_type *)&local_88);
    if (pmVar3->ptr != (Node *)0x0) {
      (*(pmVar3->ptr->super_RefCount)._vptr_RefCount[3])();
    }
    uVar1 = local_80._0_8_;
    pmVar3->ptr = (Node *)local_80._0_8_;
    local_80._0_8_ = (pointer)0x0;
    (this->path).filename._M_dataplus._M_p = (pointer)uVar1;
    if ((Node *)uVar1 != (Node *)0x0) {
      (**(code **)(*(long *)uVar1 + 0x10))();
    }
  }
  else {
    iVar2 = std::__cxx11::string::compare((char *)(*in_RDX + 0x30));
    if (iVar2 == 0) {
      loadBGFGroupNode((XMLLoader *)local_80,xml);
      pmVar3 = std::
               map<unsigned_long,_embree::Ref<embree::SceneGraph::Node>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_embree::Ref<embree::SceneGraph::Node>_>_>_>
               ::operator[]((map<unsigned_long,_embree::Ref<embree::SceneGraph::Node>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                             *)(xml + 0xc),(key_type *)&local_88);
      if (pmVar3->ptr != (Node *)0x0) {
        (*(pmVar3->ptr->super_RefCount)._vptr_RefCount[3])();
      }
      uVar1 = local_80._0_8_;
      pmVar3->ptr = (Node *)local_80._0_8_;
      local_80._0_8_ = (pointer)0x0;
      (this->path).filename._M_dataplus._M_p = (pointer)uVar1;
      if ((Node *)uVar1 != (Node *)0x0) {
        (**(code **)(*(long *)uVar1 + 0x10))();
      }
    }
    else {
      iVar2 = std::__cxx11::string::compare((char *)(*in_RDX + 0x30));
      if (iVar2 == 0) {
        loadBGFTransformNode((XMLLoader *)local_80,xml);
        pmVar3 = std::
                 map<unsigned_long,_embree::Ref<embree::SceneGraph::Node>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                 ::operator[]((map<unsigned_long,_embree::Ref<embree::SceneGraph::Node>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                               *)(xml + 0xc),(key_type *)&local_88);
        if (pmVar3->ptr != (Node *)0x0) {
          (*(pmVar3->ptr->super_RefCount)._vptr_RefCount[3])();
        }
        uVar1 = local_80._0_8_;
        pmVar3->ptr = (Node *)local_80._0_8_;
        local_80._0_8_ = (pointer)0x0;
        (this->path).filename._M_dataplus._M_p = (pointer)uVar1;
        if ((Node *)uVar1 != (Node *)0x0) {
          (**(code **)(*(long *)uVar1 + 0x10))();
        }
      }
      else {
        iVar2 = std::__cxx11::string::compare((char *)(*in_RDX + 0x30));
        if (iVar2 == 0) {
          loadBGFMaterial((XMLLoader *)local_80,xml);
          pmVar4 = std::
                   map<unsigned_long,_embree::Ref<embree::SceneGraph::MaterialNode>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_embree::Ref<embree::SceneGraph::MaterialNode>_>_>_>
                   ::operator[]((map<unsigned_long,_embree::Ref<embree::SceneGraph::MaterialNode>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_embree::Ref<embree::SceneGraph::MaterialNode>_>_>_>
                                 *)(xml + 0x12),(key_type *)&local_88);
          if ((Node *)local_80._0_8_ != (Node *)0x0) {
            (**(code **)(*(long *)local_80._0_8_ + 0x10))(local_80._0_8_);
          }
          if (pmVar4->ptr != (MaterialNode *)0x0) {
            (*(pmVar4->ptr->super_Node).super_RefCount._vptr_RefCount[3])();
          }
          pmVar4->ptr = (MaterialNode *)local_80._0_8_;
          (this->path).filename._M_dataplus._M_p = (pointer)local_80._0_8_;
          if ((Node *)local_80._0_8_ != (Node *)0x0) {
            (**(code **)(*(long *)local_80._0_8_ + 0x10))(local_80._0_8_);
            (**(code **)(*(long *)local_80._0_8_ + 0x18))(local_80._0_8_);
          }
        }
        else {
          iVar2 = std::__cxx11::string::compare((char *)(*in_RDX + 0x30));
          if (iVar2 != 0) {
            this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
            ParseLocation::str_abi_cxx11_
                      ((string *)(auStack_48 + 8),(ParseLocation *)(*in_RDX + 0x10));
            plVar5 = (long *)std::__cxx11::string::append(auStack_48 + 8);
            local_80._32_8_ = *plVar5;
            pFVar6 = (FILE *)(plVar5 + 2);
            if ((FILE *)local_80._32_8_ == pFVar6) {
              local_50 = *(size_type *)pFVar6;
              auStack_48._0_8_ = plVar5[3];
              local_80._32_8_ = (FILE *)&local_50;
            }
            else {
              local_50 = *(size_type *)pFVar6;
            }
            local_58._M_p = (pointer)plVar5[1];
            *plVar5 = (long)pFVar6;
            plVar5[1] = 0;
            *(undefined1 *)(plVar5 + 2) = 0;
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_80,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)(local_80 + 0x20),
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (*in_RDX + 0x30));
            std::runtime_error::runtime_error(this_01,(string *)local_80);
            __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          this_00 = (GroupNode *)operator_new(0x80);
          SceneGraph::GroupNode::GroupNode(this_00,0);
          (this->path).filename._M_dataplus._M_p = (pointer)this_00;
          (**(code **)((long)(this_00->super_Node).super_RefCount._vptr_RefCount + 0x10))(this_00);
        }
      }
    }
  }
  return (Ref<embree::SceneGraph::Node>)(Node *)this;
}

Assistant:

Ref<SceneGraph::Node> XMLLoader::loadBGFNode(const Ref<XML>& xml)
  {
    //const size_t id = atoi(xml->parm("id").c_str());
    const size_t id = currentNodeID++;

    if      (xml->name == "Mesh"     ) return id2node[id] = loadBGFMesh(xml);
    else if (xml->name == "Group"    ) return id2node[id] = loadBGFGroupNode(xml);
    else if (xml->name == "Transform") return id2node[id] = loadBGFTransformNode(xml);
    else if (xml->name == "Material" ) 
    {
      Ref<SceneGraph::MaterialNode> material = loadBGFMaterial(xml); 
      id2material[id] = material;
      return material.cast<SceneGraph::Node>();
    }
    else if (xml->name == "Texture2D") {
      // textures not implemented yet
      return new SceneGraph::GroupNode();
    }
    else THROW_RUNTIME_ERROR(xml->loc.str()+": unknown tag: "+xml->name);
  }